

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::SingleThreadRenderCase::executeForContexts
          (SingleThreadRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  Functions *gl;
  SharedPtr<deqp::egl::(anonymous_namespace)::Program> *this_00;
  ostringstream *poVar1;
  pointer ppVar2;
  pointer ppVar3;
  TestLog *log;
  bool bVar4;
  EGLint EVar5;
  EGLint height;
  EGLint depthBits;
  EGLint stencilBits;
  EGLint EVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  int iVar9;
  Library *egl;
  pointer pDVar10;
  long lVar11;
  Program *ptr;
  int iVar12;
  pointer pDVar13;
  ulong uVar14;
  allocator_type *__a;
  size_t __n;
  Vec4 *color;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  *this_01;
  undefined1 *__n_00;
  deInt32 a;
  ulong uVar15;
  undefined8 in_R9;
  iterator drawOp;
  pointer drawOp_00;
  int ctxNdx;
  int iVar16;
  float depth;
  PixelFormat PVar17;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  drawOps;
  Surface frame;
  Surface refFrame;
  PixelFormat pixelFmt;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  programs;
  Random rnd;
  MessageBuilder local_1b0;
  
  egl = EglTestContext::getLibrary
                  ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                   super_TestCase.m_eglTestCtx);
  EVar5 = eglu::querySurfaceInt(egl,display,surface,0x3057);
  height = eglu::querySurfaceInt(egl,display,surface,0x3056);
  ppVar2 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  PVar17 = anon_unknown_4::getPixelFormat(egl,display,config->config);
  pixelFmt = PVar17;
  depthBits = eglu::getConfigAttribInt(egl,display,config->config,0x3025);
  stencilBits = eglu::getConfigAttribInt(egl,display,config->config,0x3026);
  EVar6 = eglu::getConfigAttribInt(egl,display,config->config,0x3031);
  log = ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.super_TestCase
         .super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&refFrame,EVar5,height);
  tcu::Surface::Surface(&frame,EVar5,height);
  dVar7 = deStringHash((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                       super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  uVar15 = (ulong)((long)ppVar2 - (long)ppVar3) >> 4;
  a = (deInt32)uVar15;
  dVar8 = deInt32Hash(a);
  deRandom_init(&rnd.m_rnd,dVar7 ^ dVar8);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::vector(&programs,
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4,__a);
  drawOps.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawOps.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawOps.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"EGL_RED_SIZE = ");
  std::ostream::operator<<(poVar1,PVar17.redBits);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"EGL_GREEN_SIZE = ");
  std::ostream::operator<<(poVar1,PVar17.greenBits);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"EGL_BLUE_SIZE = ");
  std::ostream::operator<<(poVar1,PVar17.blueBits);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"EGL_ALPHA_SIZE = ");
  std::ostream::operator<<(poVar1,PVar17.alphaBits);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"EGL_DEPTH_SIZE = ");
  std::ostream::operator<<(poVar1,depthBits);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"EGL_STENCIL_SIZE = ");
  std::ostream::operator<<(poVar1,stencilBits);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"EGL_SAMPLES = ");
  std::ostream::operator<<(poVar1,EVar6);
  __n_00 = &tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  iVar9 = a * 4;
  if (iVar9 == 0) {
    pDVar13 = (pointer)0x0;
    pDVar10 = (pointer)0x0;
  }
  else {
    if (iVar9 < 0) {
      std::__throw_length_error("vector::_M_default_append");
    }
    this_01 = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
               *)(long)iVar9;
    pDVar10 = std::
              _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
              ::_M_allocate(this_01,(size_t)__n_00);
    pDVar13 = pDVar10;
    for (lVar11 = -(long)this_01; lVar11 != 0; lVar11 = lVar11 + 1) {
      (pDVar13->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pDVar13->blend = BLENDMODE_NONE;
      pDVar13->depth = DEPTHMODE_NONE;
      (pDVar13->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar13->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pDVar13->stencil = STENCILMODE_NONE;
      pDVar13->stencilRef = 0;
      (pDVar13->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar13->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pDVar13->type = PRIMITIVETYPE_TRIANGLE;
      pDVar13->count = 0;
      (pDVar13->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pDVar13 = pDVar13 + 1;
    }
    std::
    _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ::_M_deallocate((_Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                     *)0x0,(pointer)0x0,__n);
    pDVar13 = pDVar10 + (long)this_01;
    drawOps.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_start = pDVar10;
    drawOps.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar13;
    drawOps.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar13;
  }
  for (drawOp_00 = pDVar10; drawOp_00 != pDVar13; drawOp_00 = drawOp_00 + 1) {
    anon_unknown_4::randomizeDrawOp(&rnd,drawOp_00);
  }
  gl = &this->m_gl;
  lVar11 = 0;
  uVar14 = 0;
  if (0 < a) {
    uVar14 = uVar15 & 0xffffffff;
  }
  for (; ppVar2 = (contexts->
                  super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_start, uVar14 << 4 != lVar11;
      lVar11 = lVar11 + 0x10) {
    EVar5 = *(EGLint *)((long)&ppVar2->first + lVar11);
    (*egl->_vptr_Library[0x27])
              (egl,display,surface,surface,*(undefined8 *)((long)&ppVar2->second + lVar11));
    dVar7 = (*egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar7,"makeCurrent(display, surface, surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x2e2);
    ptr = anon_unknown_4::createProgram(gl,EVar5);
    de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::SharedPtr
              ((SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)&local_1b0,ptr);
    this_00 = (SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)
              ((long)&(programs.
                       super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11);
    de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::operator=
              (this_00,(SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)&local_1b0);
    de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::~SharedPtr
              ((SharedPtr<deqp::egl::(anonymous_namespace)::Program> *)&local_1b0);
    (*this_00->m_ptr->_vptr_Program[2])();
  }
  EVar5 = ppVar2->first;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar2->second);
  dVar7 = (*egl->_vptr_Library[0x1f])();
  iVar9 = 0x2ed;
  eglu::checkError(dVar7,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x2ed);
  anon_unknown_4::clear(gl,EVar5,color,depth,iVar9);
  anon_unknown_4::finish(gl,EVar5);
  iVar9 = 0;
  iVar12 = 0;
  while( true ) {
    iVar16 = (int)in_R9;
    if (iVar12 == 2) break;
    iVar16 = iVar9;
    for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      ppVar2 = (contexts->
               super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      EVar5 = ppVar2[uVar15].first;
      (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar2[uVar15].second);
      dVar7 = (*egl->_vptr_Library[0x1f])();
      eglu::checkError(dVar7,"makeCurrent(display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x2fb);
      for (lVar11 = 0; lVar11 != 0x90; lVar11 = lVar11 + 0x48) {
        anon_unknown_4::draw
                  (gl,EVar5,programs.
                            super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15].m_ptr,
                   (DrawPrimitiveOp *)((long)&pDVar10[iVar16].type + lVar11));
      }
      anon_unknown_4::finish(gl,EVar5);
      iVar16 = iVar16 + 2;
    }
    iVar12 = iVar12 + 1;
    iVar9 = iVar9 + a * 2;
  }
  ppVar2 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar5 = ppVar2->first;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar2->second);
  dVar7 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar7,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x30c);
  anon_unknown_4::readPixels(gl,EVar5,&frame);
  (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
  dVar7 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar7,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x311);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&refFrame);
  anon_unknown_4::renderReference
            ((PixelBufferAccess *)&local_1b0,&drawOps,&pixelFmt,depthBits,stencilBits,iVar16);
  bVar4 = tcu::fuzzyCompare(log,"ComparisonResult","Image comparison result",&refFrame,&frame,0.02,
                            COMPARE_LOG_RESULT);
  if (!bVar4) {
    tcu::TestContext::setTestResult
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::~vector(&drawOps);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::~vector(&programs);
  tcu::Surface::~Surface(&frame);
  tcu::Surface::~Surface(&refFrame);
  return;
}

Assistant:

void SingleThreadRenderCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	const int				width		= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
	const int				height		= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);
	const int				numContexts	= (int)contexts.size();
	const int				drawsPerCtx	= 2;
	const int				numIters	= 2;
	const float				threshold	= 0.02f;

	const tcu::PixelFormat	pixelFmt	= getPixelFormat(egl, display, config.config);
	const int				depthBits	= eglu::getConfigAttribInt(egl, display, config.config, EGL_DEPTH_SIZE);
	const int				stencilBits	= eglu::getConfigAttribInt(egl, display, config.config, EGL_STENCIL_SIZE);
	const int				numSamples	= eglu::getConfigAttribInt(egl, display, config.config, EGL_SAMPLES);

	TestLog&				log			= m_testCtx.getLog();

	tcu::Surface			refFrame	(width, height);
	tcu::Surface			frame		(width, height);

	de::Random				rnd			(deStringHash(getName()) ^ deInt32Hash(numContexts));
	vector<ProgramSp>		programs	(contexts.size());
	vector<DrawPrimitiveOp>	drawOps;

	// Log basic information about config.
	log << TestLog::Message << "EGL_RED_SIZE = "		<< pixelFmt.redBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_GREEN_SIZE = "		<< pixelFmt.greenBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_BLUE_SIZE = "		<< pixelFmt.blueBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_ALPHA_SIZE = "		<< pixelFmt.alphaBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_DEPTH_SIZE = "		<< depthBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_STENCIL_SIZE = "	<< stencilBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_SAMPLES = "			<< numSamples << TestLog::EndMessage;

	// Generate draw ops.
	drawOps.resize(numContexts*drawsPerCtx*numIters);
	for (vector<DrawPrimitiveOp>::iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); ++drawOp)
		randomizeDrawOp(rnd, *drawOp);

	// Create and setup programs per context
	for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
	{
		EGLint		api			= contexts[ctxNdx].first;
		EGLContext	context		= contexts[ctxNdx].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		programs[ctxNdx] = ProgramSp(createProgram(m_gl, api));
		programs[ctxNdx]->setup();
	}

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		clear(m_gl, api, CLEAR_COLOR, CLEAR_DEPTH, CLEAR_STENCIL);
		finish(m_gl, api);
	}

	// Render.
	for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
	{
		for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
		{
			EGLint		api			= contexts[ctxNdx].first;
			EGLContext	context		= contexts[ctxNdx].second;

			EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

			for (int drawNdx = 0; drawNdx < drawsPerCtx; drawNdx++)
			{
				const DrawPrimitiveOp& drawOp = drawOps[iterNdx*numContexts*drawsPerCtx + ctxNdx*drawsPerCtx + drawNdx];
				draw(m_gl, api, *programs[ctxNdx], drawOp);
			}

			finish(m_gl, api);
		}
	}

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		readPixels(m_gl, api, frame);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

	// Render reference.
	// \note Reference image is always generated using single-sampling.
	renderReference(refFrame.getAccess(), drawOps, pixelFmt, depthBits, stencilBits, 1);

	// Compare images
	{
		bool imagesOk = tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, threshold, tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}